

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUserDefinedIO.cpp
# Opt level: O0

void __thiscall
vkt::tessellation::anon_unknown_1::Variable::Variable
          (Variable *this,string *name_,VarType *type,bool isArray)

{
  bool isArray_local;
  VarType *type_local;
  string *name__local;
  Variable *this_local;
  
  TopLevelObject::TopLevelObject(&this->super_TopLevelObject);
  (this->super_TopLevelObject)._vptr_TopLevelObject = (_func_int **)&PTR__Variable_016b1e38;
  std::__cxx11::string::string((string *)&this->m_name,(string *)name_);
  glu::VarType::VarType(&this->m_type,type);
  this->m_isArray = isArray;
  return;
}

Assistant:

Variable (const std::string& name_, const glu::VarType& type, const bool isArray)
		: m_name		(name_)
		, m_type		(type)
		, m_isArray		(isArray)
	{
		DE_ASSERT(!type.isArrayType());
	}